

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-bookmarks.cc
# Opt level: O0

void show_bookmark_details
               (QPDFOutlineObjectHelper *outline,vector<int,_std::allocator<int>_> *numbers)

{
  bool bVar1;
  byte bVar2;
  reference piVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  string local_d8 [32];
  QPDFObjGen local_b8;
  string local_b0;
  QPDFObjGen local_90;
  undefined1 local_88 [8];
  QPDFObjectHandle dest_page;
  allocator<char> local_61;
  string local_60 [8];
  string target;
  int count;
  int *number;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> *numbers_local;
  QPDFOutlineObjectHelper *outline_local;
  
  if (style == st_none) {
    QTC::TC("examples","pdf-bookmarks none",0);
  }
  else if (style == st_numbers) {
    QTC::TC("examples","pdf-bookmarks numbers",0);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(numbers);
    number = (int *)std::vector<int,_std::allocator<int>_>::end(numbers);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)&number), bVar1) {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar3);
      std::operator<<(poVar6,".");
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::operator<<((ostream *)&std::cout," ");
  }
  else if (style == st_lines) {
    QTC::TC("examples","pdf-bookmarks lines",0);
    print_lines(numbers);
    poVar6 = std::operator<<((ostream *)&std::cout,"|");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    print_lines(numbers);
    std::operator<<((ostream *)&std::cout,"+-+ ");
  }
  if ((show_open & 1U) != 0) {
    target.field_2._12_4_ = QPDFOutlineObjectHelper::getCount();
    if (target.field_2._12_4_ == 0) {
      QTC::TC("examples","pdf-bookmarks no count",0);
      std::operator<<((ostream *)&std::cout,"( ) ");
    }
    else {
      QTC::TC("examples","pdf-bookmarks has count",0);
      if ((int)target.field_2._12_4_ < 1) {
        QTC::TC("examples","pdf-bookmarks closed",0);
        std::operator<<((ostream *)&std::cout,"(>) ");
      }
      else {
        QTC::TC("examples","pdf-bookmarks open",0);
        std::operator<<((ostream *)&std::cout,"(v) ");
      }
    }
  }
  if ((show_targets & 1U) != 0) {
    QTC::TC("examples","pdf-bookmarks targets",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_60,"unknown",&local_61);
    std::allocator<char>::~allocator(&local_61);
    QPDFOutlineObjectHelper::getDestPage();
    bVar2 = QPDFObjectHandle::isNull();
    if ((bVar2 & 1) == 0) {
      QTC::TC("examples","pdf-bookmarks dest",0);
      local_90 = qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_88);
      sVar4 = std::
              map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
              ::count(&page_map,&local_90);
      if (sVar4 != 0) {
        local_b8 = qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_88);
        pmVar5 = std::
                 map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                 ::operator[](&page_map,&local_b8);
        std::__cxx11::to_string(&local_b0,*pmVar5);
        std::__cxx11::string::operator=(local_60,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"[ -> ");
    poVar6 = std::operator<<(poVar6,local_60);
    std::operator<<(poVar6," ] ");
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_88);
    std::__cxx11::string::~string(local_60);
  }
  QPDFOutlineObjectHelper::getTitle_abi_cxx11_();
  poVar6 = std::operator<<((ostream *)&std::cout,local_d8);
  std::operator<<(poVar6,'\n');
  std::__cxx11::string::~string(local_d8);
  return;
}

Assistant:

void
show_bookmark_details(QPDFOutlineObjectHelper outline, std::vector<int> numbers)
{
    // No default so gcc will warn on missing tag
    switch (style) {
    case st_none:
        QTC::TC("examples", "pdf-bookmarks none");
        break;

    case st_numbers:
        QTC::TC("examples", "pdf-bookmarks numbers");
        for (auto const& number: numbers) {
            std::cout << number << ".";
        }
        std::cout << " ";
        break;

    case st_lines:
        QTC::TC("examples", "pdf-bookmarks lines");
        print_lines(numbers);
        std::cout << "|" << std::endl;
        print_lines(numbers);
        std::cout << "+-+ ";
        break;
    }

    if (show_open) {
        int count = outline.getCount();
        if (count) {
            QTC::TC("examples", "pdf-bookmarks has count");
            if (count > 0) {
                // hierarchy is open at this point
                QTC::TC("examples", "pdf-bookmarks open");
                std::cout << "(v) ";
            } else {
                QTC::TC("examples", "pdf-bookmarks closed");
                std::cout << "(>) ";
            }
        } else {
            QTC::TC("examples", "pdf-bookmarks no count");
            std::cout << "( ) ";
        }
    }

    if (show_targets) {
        QTC::TC("examples", "pdf-bookmarks targets");
        std::string target = "unknown";
        QPDFObjectHandle dest_page = outline.getDestPage();
        if (!dest_page.isNull()) {
            QTC::TC("examples", "pdf-bookmarks dest");
            if (page_map.count(dest_page)) {
                target = std::to_string(page_map[dest_page]);
            }
        }
        std::cout << "[ -> " << target << " ] ";
    }

    std::cout << outline.getTitle() << '\n';
}